

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  sqlite3 *db;
  uint in_EAX;
  u32 v;
  undefined8 uStack_18;
  
  if (op == 99) {
    db = *(sqlite3 **)pStmt;
    uStack_18._0_4_ = in_EAX;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    uStack_18 = (ulong)(uint)uStack_18;
    db->pnBytesFreed = (int *)((long)&uStack_18 + 4);
    sqlite3VdbeClearObject(db,(Vdbe *)pStmt);
    sqlite3DbFreeNN(db,pStmt);
    db->pnBytesFreed = (int *)0x0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    uStack_18 = (ulong)*(uint *)(pStmt + (long)op * 4 + 0xcc) << 0x20;
    if (resetFlag != 0) {
      *(undefined4 *)(pStmt + (long)op * 4 + 0xcc) = 0;
    }
  }
  return uStack_18._4_4_;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    sqlite3VdbeClearObject(db, pVdbe);
    sqlite3DbFree(db, pVdbe);
    db->pnBytesFreed = 0;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}